

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstar.cpp
# Opt level: O0

bool __thiscall DSDcc::DSDDstar::DPRS::matchDSTAR(DPRS *this,char *d)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  char *in_RSI;
  float *in_RDI;
  double dVar4;
  double deg;
  double min;
  double x;
  char lonH;
  char latH;
  char lonStr [9];
  char latStr [8];
  char *pch;
  LocPoint *in_stack_ffffffffffffffb0;
  undefined8 local_31;
  undefined1 local_29;
  undefined4 local_28;
  undefined2 local_24;
  char local_22;
  undefined1 local_21;
  char *local_20;
  bool local_1;
  
  pcVar2 = strstr(in_RSI,"DSTAR*:/");
  if (pcVar2 == (char *)0x0) {
    local_1 = false;
  }
  else {
    local_20 = pcVar2 + 0xf;
    local_28 = *(undefined4 *)local_20;
    local_24 = *(undefined2 *)(pcVar2 + 0x13);
    local_22 = pcVar2[0x15];
    local_21 = 0;
    cVar1 = pcVar2[0x16];
    dVar4 = atof((char *)&local_28);
    dVar4 = modf(dVar4 / 100.0,(double *)&stack0xffffffffffffffb0);
    iVar3 = -1;
    if (cVar1 == 'N') {
      iVar3 = 1;
    }
    in_RDI[1] = (float)(((double)in_stack_ffffffffffffffb0 + (dVar4 * 100.0) / 60.0) * (double)iVar3
                       );
    local_31 = *(undefined8 *)(local_20 + 9);
    local_29 = 0;
    cVar1 = local_20[0x11];
    local_20 = local_20 + 9;
    dVar4 = atof((char *)&local_31);
    dVar4 = modf(dVar4 / 100.0,(double *)&stack0xffffffffffffffb0);
    iVar3 = -1;
    if (cVar1 == 'E') {
      iVar3 = 1;
    }
    *in_RDI = (float)(((double)in_stack_ffffffffffffffb0 + (dVar4 * 100.0) / 60.0) * (double)iVar3);
    LocPoint::setLatLon(in_stack_ffffffffffffffb0,(float)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0));
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool DSDDstar::DPRS::matchDSTAR(const char *d)
{
    const char *pch;
    char latStr[7+1];
    char lonStr[8+1];
    char latH, lonH;
    double x, min, deg;

    pch = strstr (d, "DSTAR*:/");

    if (pch)
    {
        pch += 15;

        memcpy(latStr, pch, 7);
        latStr[7] = '\0';
        latH = pch[7];
        x = atof(latStr);
        x /= 100.0f;
        min = modf(x, &deg);
        m_lat = (deg + ((min*100.0f)/60.0f))*(latH == 'N' ? 1 : -1);

        pch += 9;

        memcpy(lonStr, pch, 8);
        lonStr[8] = '\0';
        lonH = pch[8];
        x = atof(lonStr);
        x /= 100.0f;
        min = modf(x, &deg);
        m_lon = (deg + ((min*100.0f)/60.0f))*(lonH == 'E' ? 1 : -1);

        m_locPoint.setLatLon(m_lat, m_lon);

        return true;
    }
    else
    {
        return false;
    }
}